

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temp.hpp
# Opt level: O0

string * __thiscall
just::temp::directory::dir_t::next_file_abi_cxx11_(string *__return_storage_ptr__,dir_t *this)

{
  bool bVar1;
  dirent *pdVar2;
  dirent *d;
  string f;
  dir_t *this_local;
  
  f.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)&d);
  if ((this->_eod & 1U) == 0) {
    pdVar2 = readdir((DIR *)this->_d);
    if (pdVar2 == (dirent *)0x0) {
      this->_eod = true;
    }
    else {
      std::__cxx11::string::operator=((string *)&d,pdVar2->d_name);
    }
  }
  if (((this->_eod & 1U) == 0) &&
     ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &d,"."), bVar1 ||
      (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &d,".."), bVar1)))) {
    next_file_abi_cxx11_(__return_storage_ptr__,this);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&d);
  }
  std::__cxx11::string::~string((string *)&d);
  return __return_storage_ptr__;
}

Assistant:

std::string next_file()
        {
          std::string f;
          if (!_eod)
          {
#ifdef _WIN32
            if (_next_eod)
            {
              _eod = true;
            }
            else
            {
              f = _data.cFileName;
              _next_eod = !FindNextFile(_d, &_data);
            }
#else
            if (dirent* d = readdir(_d))
            {
              f = d->d_name;
            }
            else
            {
              _eod = true;
            }
#endif
          }

          return (!_eod && (f == "." || f == "..")) ? next_file() : f;
        }